

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  _Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_> _Var1;
  Expr *pEVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> uVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  Result RVar7;
  Expr *pEVar8;
  TryExpr *this_00;
  intrusive_list_base<wabt::Expr> *piVar9;
  ExprList *pEVar10;
  long *plVar11;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var12;
  long lVar13;
  iterator pos;
  Var var;
  Location loc;
  undefined1 local_108 [32];
  Expr *local_e8 [2];
  undefined1 local_d8 [16];
  long local_c8 [4];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  Location local_88;
  ExprList *local_60;
  _Head_base<0UL,_wabt::Expr_*,_false> local_58;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  _Head_base<0UL,_wabt::Expr_*,_false> local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  
  TVar5 = Peek(this,0);
  RVar6.enum_ = Error;
  if (TVar5 != Lpar) {
    return (Result)Error;
  }
  TVar5 = Peek(this,1);
  bVar4 = anon_unknown_1::IsPlainInstr(TVar5);
  if (!bVar4) {
    GetToken((Token *)local_108,this);
    local_88.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_108._16_8_;
    local_88.field_1._8_8_ = local_108._24_8_;
    local_88.filename._M_len = local_108._0_8_;
    local_88.filename._M_str = (char *)local_108._8_8_;
    TVar5 = Peek(this,1);
    if ((int)TVar5 < 0x5f) {
      if (TVar5 == Block) {
        Consume((Token *)local_108,this);
        Consume((Token *)local_108,this);
        this_00 = (TryExpr *)operator_new(0x118);
        *(undefined8 *)&this_00->field_0x8 = 0;
        *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
        *(size_t *)&this_00->field_0x18 = local_88.filename._M_len;
        *(char **)(&this_00->field_0x18 + 8) = local_88.filename._M_str;
        *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
         (&this_00->field_0x18 + 0x10) = local_88.field_1.field_1.offset;
        *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_88.field_1._8_8_;
        *(undefined4 *)&this_00->field_0x38 = 8;
        *(undefined ***)&this_00->field_0x0 = &PTR__BlockExprBase_001a4f20;
        (this_00->block).label._M_dataplus._M_p = (pointer)&(this_00->block).label.field_2;
        (this_00->block).label._M_string_length = 0;
        (this_00->block).label.field_2._M_local_buf[0] = '\0';
        (this_00->block).decl.has_func_type = false;
        Var::Var(&(this_00->block).decl.type_var);
        (this_00->block).end_loc.filename._M_str = (char *)0x0;
        (this_00->block).end_loc.field_1.field_1.offset = 0;
        (this_00->block).exprs.size_ = 0;
        (this_00->block).end_loc.filename._M_len = 0;
        (this_00->block).exprs.first_ = (Expr *)0x0;
        (this_00->block).exprs.last_ = (Expr *)0x0;
        (this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        (this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        (this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_start = 0;
        (this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this_00->block).end_loc.field_1.field_0.last_column = 0;
        RVar7 = ParseLabelOpt(this,&(this_00->block).label);
        if ((RVar7.enum_ != Error) &&
           (RVar7 = ParseBlock(this,&this_00->block), RVar7.enum_ != Error)) {
          local_38._M_head_impl = (Expr *)this_00;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
          if ((TryExpr *)local_38._M_head_impl != (TryExpr *)0x0) {
            (*(local_38._M_head_impl)->_vptr_Expr[1])();
          }
          local_38._M_head_impl = (Expr *)0x0;
          goto LAB_00136b7d;
        }
      }
      else {
        if (TVar5 != If) {
LAB_00137070:
          __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0xcef,"Result wabt::WastParser::ParseExpr(ExprList *)");
        }
        Consume((Token *)local_108,this);
        Consume((Token *)local_108,this);
        this_00 = (TryExpr *)operator_new(0x150);
        *(undefined8 *)&this_00->field_0x8 = 0;
        *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
        *(size_t *)&this_00->field_0x18 = local_88.filename._M_len;
        *(char **)(&this_00->field_0x18 + 8) = local_88.filename._M_str;
        *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
         (&this_00->field_0x18 + 0x10) = local_88.field_1.field_1.offset;
        *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_88.field_1._8_8_;
        *(undefined4 *)&this_00->field_0x38 = 0x16;
        *(undefined ***)&this_00->field_0x0 = &PTR__IfExpr_001a4fc0;
        (this_00->block).label._M_dataplus._M_p = (pointer)&(this_00->block).label.field_2;
        (this_00->block).label._M_string_length = 0;
        (this_00->block).label.field_2._M_local_buf[0] = '\0';
        (this_00->block).decl.has_func_type = false;
        Var::Var(&(this_00->block).decl.type_var);
        (this_00->block).end_loc.field_1.field_0.last_column = 0;
        (this_00->block).end_loc.filename._M_str = (char *)0x0;
        (this_00->block).end_loc.field_1.field_1.offset = 0;
        (this_00->block).exprs.size_ = 0;
        (this_00->block).end_loc.filename._M_len = 0;
        (this_00->block).exprs.first_ = (Expr *)0x0;
        (this_00->block).exprs.last_ = (Expr *)0x0;
        (this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        (this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        (this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_start = 0;
        (this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this_00->delegate_target).loc.filename._M_len = 0;
        (this_00->delegate_target).loc.filename._M_str = (char *)0x0;
        (this_00->delegate_target).loc.field_1.field_1.offset = 0;
        (this_00->delegate_target).loc.field_1.field_0.last_column = 0;
        RVar7 = ParseLabelOpt(this,&(this_00->block).label);
        RVar6.enum_ = Error;
        if ((RVar7.enum_ != Error) &&
           (RVar7 = ParseBlockDeclaration(this,&(this_00->block).decl), RVar7.enum_ != Error)) {
          local_60 = (ExprList *)&this_00->catches;
          do {
            bVar4 = PeekMatchExpr(this);
            if (!bVar4) {
              RVar6 = Expect(this,Lpar);
              if (RVar6.enum_ != Error) {
                bVar4 = Match(this,Then);
                RVar6.enum_ = Error;
                if (!bVar4) {
                  local_108._0_8_ = (Expr *)(local_108 + 0x10);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_108,"then block","");
                  local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                  _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                       (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
                  uStack_a0._0_4_ = AtomicLoad;
                  uStack_a0._4_4_ = 0;
                  local_98 = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_initialize<std::__cxx11::string_const*>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_a8,local_108,local_e8);
                  RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)&local_a8,"(then ...)");
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_a8);
                  if ((Expr *)local_108._0_8_ != (Expr *)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
                  }
                  goto LAB_00136bf9;
                }
                RVar7 = ParseTerminatingInstrList(this,&(this_00->block).exprs);
                if (RVar7.enum_ == Error) goto LAB_00136bf9;
                GetToken((Token *)local_108,this);
                (this_00->block).end_loc.field_1.field_1.offset = local_108._16_8_;
                *(undefined8 *)((long)&(this_00->block).end_loc.field_1 + 8) = local_108._24_8_;
                (this_00->block).end_loc.filename._M_len = local_108._0_8_;
                (this_00->block).end_loc.filename._M_str = (char *)local_108._8_8_;
                RVar7 = Expect(this,Rpar);
                if ((RVar7.enum_ == Error) ||
                   ((bVar4 = MatchLpar(this,Else), bVar4 &&
                    ((RVar7 = ParseTerminatingInstrList(this,local_60), RVar7.enum_ == Error ||
                     (RVar7 = Expect(this,Rpar), RVar7.enum_ == Error)))))) goto LAB_00136bf9;
                GetToken((Token *)local_108,this);
                (this_00->delegate_target).loc.field_1.field_1.offset = local_108._16_8_;
                *(undefined8 *)((long)&(this_00->delegate_target).loc.field_1 + 8) =
                     local_108._24_8_;
                (this_00->delegate_target).loc.filename._M_len = local_108._0_8_;
                (this_00->delegate_target).loc.filename._M_str = (char *)local_108._8_8_;
                local_48._M_head_impl = (Expr *)this_00;
                intrusive_list<wabt::Expr>::push_back
                          (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_48);
                if ((TryExpr *)local_48._M_head_impl != (TryExpr *)0x0) {
                  (*(local_48._M_head_impl)->_vptr_Expr[1])();
                }
                local_48._M_head_impl = (Expr *)0x0;
                goto LAB_00136b7d;
              }
              break;
            }
            local_108._0_8_ = (Expr *)0x0;
            local_108._8_8_ = (Expr *)0x0;
            local_108._16_8_ = 0;
            RVar6 = ParseExpr(this,(ExprList *)local_108);
            pEVar8 = (Expr *)local_108._0_8_;
            if (RVar6.enum_ != Error) {
              _Var12._M_head_impl = (Expr *)local_108._0_8_;
              if ((Expr *)local_108._0_8_ == (Expr *)0x0) {
                pEVar8 = (Expr *)0x0;
              }
              else {
                do {
                  if (local_108._16_8_ == 0) {
                    __assert_fail("!empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                                  ,0x221,
                                  "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                                 );
                  }
                  _Var1.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                       (_Head_base<0UL,_wabt::Expr_*,_false>)
                       ((_Var12._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_;
                  if (local_108._0_8_ == local_108._8_8_) {
                    local_108._0_8_ = (Expr *)0x0;
                    local_108._8_8_ = (Expr *)0x0;
                    pEVar8 = (Expr *)local_108._8_8_;
                  }
                  else {
                    pEVar8 = ((_Var12._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_;
                    piVar9 = &pEVar8->super_intrusive_list_base<wabt::Expr>;
                    if (pEVar8 == (Expr *)0x0) {
                      piVar9 = (intrusive_list_base<wabt::Expr> *)local_108;
                    }
                    piVar9->next_ =
                         (Expr *)_Var1.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
                    if (_Var1.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0
                       ) {
                      *(Expr **)((long)_Var1.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl
                                + 0x10) = pEVar8;
                      pEVar8 = (Expr *)local_108._8_8_;
                    }
                  }
                  local_108._8_8_ = pEVar8;
                  local_108._16_8_ = local_108._16_8_ - 1;
                  ((_Var12._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0
                  ;
                  ((_Var12._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0
                  ;
                  pos.node_ = (Expr *)0x0;
                  pos.list_ = exprs;
                  local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                  _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                       _Var12._M_head_impl;
                  intrusive_list<wabt::Expr>::insert(exprs,pos,&local_a8);
                  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
                      local_a8._M_t.
                      super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
                    (**(code **)(*(long *)local_a8._M_t.
                                          super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                          .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl +
                                8))();
                  }
                  local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                  _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                       (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
                  _Var12._M_head_impl =
                       (Expr *)_Var1.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
                  pEVar8 = (Expr *)local_108._0_8_;
                } while (_Var1.super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl !=
                         (Expr *)0x0);
              }
            }
            while (pEVar8 != (Expr *)0x0) {
              pEVar2 = (pEVar8->super_intrusive_list_base<wabt::Expr>).next_;
              (*pEVar8->_vptr_Expr[1])();
              pEVar8 = pEVar2;
            }
          } while (RVar6.enum_ != Error);
          RVar6.enum_ = Error;
        }
      }
      goto LAB_00136bf9;
    }
    if (TVar5 == Loop) {
      Consume((Token *)local_108,this);
      Consume((Token *)local_108,this);
      this_00 = (TryExpr *)operator_new(0x118);
      *(undefined8 *)&this_00->field_0x8 = 0;
      *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
      *(size_t *)&this_00->field_0x18 = local_88.filename._M_len;
      *(char **)(&this_00->field_0x18 + 8) = local_88.filename._M_str;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       (&this_00->field_0x18 + 0x10) = local_88.field_1.field_1.offset;
      *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_88.field_1._8_8_;
      *(undefined4 *)&this_00->field_0x38 = 0x1b;
      *(undefined ***)&this_00->field_0x0 = &PTR__BlockExprBase_001a4f70;
      (this_00->block).label._M_dataplus._M_p = (pointer)&(this_00->block).label.field_2;
      (this_00->block).label._M_string_length = 0;
      (this_00->block).label.field_2._M_local_buf[0] = '\0';
      (this_00->block).decl.has_func_type = false;
      Var::Var(&(this_00->block).decl.type_var);
      (this_00->block).end_loc.filename._M_str = (char *)0x0;
      (this_00->block).end_loc.field_1.field_1.offset = 0;
      (this_00->block).exprs.size_ = 0;
      (this_00->block).end_loc.filename._M_len = 0;
      (this_00->block).exprs.first_ = (Expr *)0x0;
      (this_00->block).exprs.last_ = (Expr *)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_start = 0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->block).end_loc.field_1.field_0.last_column = 0;
      RVar7 = ParseLabelOpt(this,&(this_00->block).label);
      if ((RVar7.enum_ == Error) || (RVar7 = ParseBlock(this,&this_00->block), RVar7.enum_ == Error)
         ) goto LAB_00136bf9;
      local_40._M_head_impl = (Expr *)this_00;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
      if ((TryExpr *)local_40._M_head_impl != (TryExpr *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Expr[1])();
      }
      local_40._M_head_impl = (Expr *)0x0;
      goto LAB_00136b7d;
    }
    if (TVar5 != Try) {
      if (TVar5 != TryTable) goto LAB_00137070;
      Consume((Token *)local_108,this);
      Consume((Token *)local_108,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_108);
      pEVar8 = (Expr *)operator_new(0x130);
      (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar8->loc).filename._M_len = local_88.filename._M_len;
      (pEVar8->loc).filename._M_str = local_88.filename._M_str;
      (pEVar8->loc).field_1.field_1.offset = (size_t)local_88.field_1.field_1.offset;
      *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = local_88.field_1._8_8_;
      pEVar8->type_ = TryTable;
      pEVar8->_vptr_Expr = (_func_int **)&PTR__TryTableExpr_001a5060;
      pEVar8[1]._vptr_Expr = (_func_int **)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_;
      pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined1 *)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      *(undefined1 *)&pEVar8[1].loc.filename._M_str = 0;
      Var::Var((Var *)&pEVar8[1].loc.field_1.field_0);
      pEVar8[4]._vptr_Expr = (_func_int **)0x0;
      pEVar8[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar8[3].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar8[3].type_ = 0;
      pEVar8[3].loc.filename._M_str = (char *)0x0;
      pEVar8[3].loc.field_1.field_1.offset = 0;
      pEVar8[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
      pEVar8[3].loc.filename._M_len = 0;
      pEVar8[3]._vptr_Expr = (_func_int **)0x0;
      pEVar8[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar8[2].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar8[2].type_ = 0;
      *(undefined4 *)&pEVar8[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      pEVar8[4].loc.filename._M_len = 0;
      pEVar8[4].loc.filename._M_str = (char *)0x0;
      pEVar8[4].loc.field_1.field_1.offset = 0;
      RVar6 = ParseLabelOpt(this,(string *)(pEVar8 + 1));
      if ((((RVar6.enum_ == Error) ||
           (RVar6 = ParseBlockDeclaration(this,(BlockDeclaration *)&pEVar8[1].loc.filename._M_str),
           RVar6.enum_ == Error)) ||
          (RVar6 = ParseTryTableCatches(this,(TryTableVector *)&pEVar8[4].loc), RVar6.enum_ == Error
          )) || (RVar6 = ParseInstrList(this,(ExprList *)&pEVar8[3].loc.filename._M_str),
                RVar6.enum_ == Error)) {
        (*pEVar8->_vptr_Expr[1])(pEVar8);
        return (Result)Error;
      }
      GetToken((Token *)local_108,this);
      pEVar8[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_108._16_8_;
      pEVar8[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)local_108._24_8_;
      *(undefined8 *)&pEVar8[3].type_ = local_108._0_8_;
      pEVar8[4]._vptr_Expr = (_func_int **)local_108._8_8_;
      local_58._M_head_impl = pEVar8;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_58);
      if (local_58._M_head_impl != (Expr *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Expr[1])();
      }
      local_58._M_head_impl = (Expr *)0x0;
      goto LAB_00136b7d;
    }
    Consume((Token *)local_108,this);
    Consume((Token *)local_108,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_108);
    this_00 = (TryExpr *)operator_new(0x178);
    TryExpr::TryExpr(this_00,&local_88);
    RVar7 = ParseLabelOpt(this,&(this_00->block).label);
    if ((((RVar7.enum_ == Error) ||
         (RVar7 = ParseBlockDeclaration(this,&(this_00->block).decl), RVar7.enum_ == Error)) ||
        ((RVar7 = Expect(this,Lpar), RVar7.enum_ == Error ||
         ((RVar7 = Expect(this,Do), RVar7.enum_ == Error ||
          (RVar7 = ParseInstrList(this,&(this_00->block).exprs), RVar7.enum_ == Error)))))) ||
       (RVar7 = Expect(this,Rpar), RVar7.enum_ == Error)) goto LAB_00136bf9;
    TVar5 = Peek(this,0);
    if (TVar5 == Lpar) {
      Consume((Token *)local_108,this);
      TVar5 = Peek(this,0);
      if (TVar5 - Catch < 2) {
        RVar7 = ParseCatchExprList(this,&this_00->catches);
        if (RVar7.enum_ == Error) goto LAB_00136bf9;
        this_00->kind = Catch;
      }
      else {
        if (TVar5 == Delegate) {
          Consume((Token *)local_108,this);
          Var::Var((Var *)local_108);
          RVar7 = ParseVar(this,(Var *)local_108);
          if (RVar7.enum_ != Error) {
            Var::operator=(&this_00->delegate_target,(Var *)local_108);
            this_00->kind = Delegate;
            RVar7 = Expect(this,Rpar);
            if (RVar7.enum_ != Error) {
              Var::~Var((Var *)local_108);
              goto LAB_00136f39;
            }
          }
          Var::~Var((Var *)local_108);
          goto LAB_00136bf9;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"catch","");
        local_e8[0] = (Expr *)local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"catch_all","");
        plVar11 = local_c8 + 2;
        local_c8[0] = (long)plVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"delegate","");
        local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
        super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
             (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
             (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
        uStack_a0._0_4_ = AtomicLoad;
        uStack_a0._4_4_ = 0;
        local_98 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                   local_108,&local_a8);
        ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_a8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
        lVar13 = -0x60;
        do {
          if (plVar11 != (long *)plVar11[-2]) {
            operator_delete((long *)plVar11[-2],*plVar11 + 1);
          }
          plVar11 = plVar11 + -4;
          lVar13 = lVar13 + 0x20;
        } while (lVar13 != 0);
      }
    }
LAB_00136f39:
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"a valid try clause","");
    local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
         (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
    uStack_a0._0_4_ = AtomicLoad;
    uStack_a0._4_4_ = 0;
    local_98 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               local_108);
    RVar7 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a8,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    if ((Expr *)local_108._0_8_ != (Expr *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    RVar6.enum_ = Error;
    if (RVar7.enum_ == Error) {
LAB_00136bf9:
      (**(code **)(*(long *)this_00 + 8))(this_00);
      return (Result)RVar6.enum_;
    }
    GetToken((Token *)local_108,this);
    (this_00->block).end_loc.field_1.field_1.offset = local_108._16_8_;
    *(undefined8 *)((long)&(this_00->block).end_loc.field_1 + 8) = local_108._24_8_;
    (this_00->block).end_loc.filename._M_len = local_108._0_8_;
    (this_00->block).end_loc.filename._M_str = (char *)local_108._8_8_;
    local_50._M_head_impl = (Expr *)this_00;
    intrusive_list<wabt::Expr>::push_back
              (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
    if ((TryExpr *)local_50._M_head_impl != (TryExpr *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Expr[1])();
    }
    local_50._M_head_impl = (Expr *)0x0;
    goto LAB_00136b7d;
  }
  Consume((Token *)local_108,this);
  local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
       (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
  RVar6 = ParsePlainInstr(this,&local_a8);
  if ((RVar6.enum_ == Error) || (RVar6 = ParseExprList(this,exprs), RVar6.enum_ == Error)) {
LAB_00136b62:
    bVar4 = false;
  }
  else {
    local_108._0_8_ = (Expr *)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"an expr","");
    local_88.filename._M_len = 0;
    local_88.filename._M_str = (char *)0x0;
    local_88.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               local_108,local_e8);
    bVar4 = Match(this,Lpar);
    if (bVar4) {
      RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_88,(char *)0x0);
      bVar4 = RVar6.enum_ == Error;
    }
    else {
      bVar4 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
    if ((Expr *)local_108._0_8_ != (Expr *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    uVar3._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)local_a8;
    if (bVar4) goto LAB_00136b62;
    local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
         (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
    if ((*(Expr **)((long)uVar3._M_t.
                          super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) !=
         (Expr *)0x0) ||
       (((intrusive_list_base<wabt::Expr> *)
        ((long)uVar3._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))->next_ != (Expr *)0x0))
    {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x1bd,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar8 = exprs->last_;
    pEVar10 = exprs;
    if (pEVar8 != (Expr *)0x0) {
      *(Expr **)((long)uVar3._M_t.
                       super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = pEVar8;
      pEVar10 = (ExprList *)&pEVar8->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar10->first_ =
         (Expr *)uVar3._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
                 .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    exprs->last_ = (Expr *)uVar3._M_t.
                           super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    exprs->size_ = exprs->size_ + 1;
    bVar4 = true;
  }
  if (local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0) {
    (**(code **)(*(long *)local_a8._M_t.
                          super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  if (!bVar4) {
    return (Result)Error;
  }
LAB_00136b7d:
  RVar6 = Expect(this,Rpar);
  return (Result)(uint)(RVar6.enum_ == Error);
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        while (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        EXPECT(Lpar);
        if (!Match(TokenType::Then)) {
          return ErrorExpected({"then block"}, "(then ...)");
        }

        CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
        expr->true_.end_loc = GetLocation();
        EXPECT(Rpar);

        if (MatchLpar(TokenType::Else)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
          EXPECT(Rpar);
        }
        expr->false_end_loc = GetLocation();

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::TryTable: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = std::make_unique<TryTableExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseTryTableCatches(&expr->catches));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}